

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O1

void __thiscall QTabBarPrivate::scrollTabs(QTabBarPrivate *this)

{
  int iVar1;
  Tab *pTVar2;
  QRect *pQVar3;
  QToolButton *pQVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  Representation *pRVar9;
  QRect QVar10;
  
  pQVar4 = (QToolButton *)QObject::sender();
  uVar6 = this->shape - RoundedWest;
  QVar10 = normalizedScrollRect(this,-1);
  iVar1 = this->scrollOffset;
  if (pQVar4 == this->leftB) {
    uVar8 = (this->tabList).d.size;
    uVar5 = uVar8 & 0xffffffff;
    while( true ) {
      uVar5 = uVar5 - 1;
      uVar7 = (int)uVar8 - 1;
      uVar8 = (ulong)uVar7;
      if ((int)uVar7 < 0) break;
      if ((&((this->tabList).d.ptr[(uint)uVar5 & 0x7fffffff]->rect).x1)[(uVar6 & 0xfffffffa) == 0].
          m_i < iVar1 + QVar10.x1.m_i.m_i) {
LAB_00491d64:
        makeVisible(this,(int)uVar8);
        return;
      }
    }
  }
  else if ((pQVar4 == this->rightB) && (uVar5 = (this->tabList).d.size, uVar5 != 0)) {
    uVar8 = 0;
    do {
      pTVar2 = (this->tabList).d.ptr[uVar8];
      pQVar3 = (QRect *)&(pTVar2->rect).y1;
      pRVar9 = &(pTVar2->rect).y2;
      if ((uVar6 & 0xfffffffa) != 0) {
        pRVar9 = &(pTVar2->rect).x2;
        pQVar3 = &pTVar2->rect;
      }
      if ((QVar10.x2.m_i.m_i + iVar1 < pRVar9->m_i) && (iVar1 < (pQVar3->x1).m_i))
      goto LAB_00491d64;
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  return;
}

Assistant:

void QTabBarPrivate::scrollTabs()
{
    Q_Q(QTabBar);
    const QObject *sender = q->sender();
    const bool horizontal = !verticalTabs(shape);
    const QRect scrollRect = normalizedScrollRect().translated(scrollOffset, 0);

    int i = -1;

    if (sender == leftB) {
        for (i = tabList.size() - 1; i >= 0; --i) {
            int start = horizontal ? tabList.at(i)->rect.left() : tabList.at(i)->rect.top();
            if (start < scrollRect.left()) {
                makeVisible(i);
                return;
            }
        }
    } else if (sender == rightB) {
        for (i = 0; i < tabList.size(); ++i) {
            const auto tabRect = tabList.at(i)->rect;
            int start = horizontal ? tabRect.left() : tabRect.top();
            int end = horizontal ? tabRect.right() : tabRect.bottom();
            if (end > scrollRect.right() && start > scrollOffset) {
                makeVisible(i);
                return;
            }
        }
    }
}